

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void scm_spaceship(void)

{
  cell_map local_28;
  
  scm_stop();
  if (width < 7) {
    width = 7;
  }
  if (height < 6) {
    height = 6;
  }
  cell_map::cell_map(&local_28,width,height);
  grid.width = local_28.width;
  grid.height = local_28.height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&grid.cells,&local_28.cells);
  if (local_28.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.cells.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.cells.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cell_map::set_cell(&grid,2,5);
  cell_map::set_cell(&grid,2,3);
  cell_map::set_cell(&grid,3,2);
  cell_map::set_cell(&grid,4,2);
  cell_map::set_cell(&grid,5,5);
  cell_map::set_cell(&grid,5,2);
  cell_map::set_cell(&grid,6,2);
  cell_map::set_cell(&grid,6,3);
  cell_map::set_cell(&grid,6,4);
  paint_grid();
  return;
}

Assistant:

void scm_spaceship()
  {
  scm_stop();
  if (width < 7)
    width = 7;
  if (height < 6)
    height = 6;
  grid = cell_map(width, height);

  grid.set_cell(2, 5);
  grid.set_cell(2, 3);
  grid.set_cell(3, 2);
  grid.set_cell(4, 2);
  grid.set_cell(5, 5);
  grid.set_cell(5, 2);
  grid.set_cell(6, 2);
  grid.set_cell(6, 3);
  grid.set_cell(6, 4);

  paint_grid();
  }